

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacon2.c
# Opt level: O0

int slacon2_(int *n,float *v,float *x,int *isgn,float *est,int *kase,int *isave)

{
  float fVar1;
  int iVar2;
  integer iVar3;
  real rVar4;
  double dVar5;
  double local_a8;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  int local_5c;
  float temp;
  int i;
  float estold;
  float altsgn;
  int jlast;
  float one;
  float zero;
  int c__1;
  int *kase_local;
  float *est_local;
  int *isgn_local;
  float *x_local;
  float *v_local;
  int *n_local;
  
  one = 1.4013e-45;
  if (*kase == 0) {
    for (local_5c = 0; local_5c < *n; local_5c = local_5c + 1) {
      x[local_5c] = 1.0 / (float)*n;
    }
    *kase = 1;
    *isave = 1;
    return 0;
  }
  _zero = kase;
  kase_local = (int *)est;
  est_local = (float *)isgn;
  isgn_local = (int *)x;
  x_local = v;
  v_local = (float *)n;
  switch(*isave) {
  case 1:
  default:
    if (*n == 1) {
      *v = *x;
      *est = ABS(*v);
LAB_001191f8:
      *_zero = 0;
    }
    else {
      rVar4 = sasum_(n,x,(integer *)&one);
      *kase_local = (int)rVar4;
      for (local_5c = 0; local_5c < (int)*v_local; local_5c = local_5c + 1) {
        if ((float)isgn_local[local_5c] < 0.0) {
          iVar2 = -0x40800000;
        }
        else {
          iVar2 = 0x3f800000;
        }
        isgn_local[local_5c] = iVar2;
        if ((float)isgn_local[local_5c] < 0.0) {
          local_78 = floor(0.5 - (double)(float)isgn_local[local_5c]);
          local_78 = -local_78;
        }
        else {
          local_78 = floor((double)(float)isgn_local[local_5c] + 0.5);
        }
        est_local[local_5c] = (float)(int)local_78;
      }
      *_zero = 2;
      *isave = 2;
    }
    break;
  case 2:
    iVar3 = isamax_(n,x,(integer *)&one);
    isave[1] = iVar3;
    isave[1] = isave[1] + -1;
    isave[2] = 2;
    goto LAB_00118c57;
  case 3:
    scopy_(n,x,(integer *)&one,v,(integer *)&one);
    fVar1 = (float)*kase_local;
    rVar4 = sasum_((integer *)v_local,x_local,(integer *)&one);
    *kase_local = (int)rVar4;
    for (local_5c = 0; local_5c < (int)*v_local; local_5c = local_5c + 1) {
      if ((float)isgn_local[local_5c] < 0.0) {
        local_80 = -1.0;
      }
      else {
        local_80 = 1.0;
      }
      if (local_80 < 0.0) {
        if ((float)isgn_local[local_5c] < 0.0) {
          local_98 = -1.0;
        }
        else {
          local_98 = 1.0;
        }
        local_90 = floor(0.5 - local_98);
        local_90 = -local_90;
      }
      else {
        if ((float)isgn_local[local_5c] < 0.0) {
          local_88 = -1.0;
        }
        else {
          local_88 = 1.0;
        }
        local_90 = floor(local_88 + 0.5);
      }
      if ((local_90 != (double)(int)est_local[local_5c]) ||
         (NAN(local_90) || NAN((double)(int)est_local[local_5c]))) {
        if (fVar1 < (float)*kase_local) {
          for (local_5c = 0; local_5c < (int)*v_local; local_5c = local_5c + 1) {
            if ((float)isgn_local[local_5c] < 0.0) {
              iVar2 = -0x40800000;
            }
            else {
              iVar2 = 0x3f800000;
            }
            isgn_local[local_5c] = iVar2;
            if ((float)isgn_local[local_5c] < 0.0) {
              local_a8 = floor(0.5 - (double)(float)isgn_local[local_5c]);
              local_a8 = -local_a8;
            }
            else {
              local_a8 = floor((double)(float)isgn_local[local_5c] + 0.5);
            }
            est_local[local_5c] = (float)(int)local_a8;
          }
          *_zero = 2;
          *isave = 4;
          return 0;
        }
        break;
      }
    }
LAB_001190de:
    i = 0x3f800000;
    for (local_5c = 1; local_5c <= (int)*v_local; local_5c = local_5c + 1) {
      isgn_local[local_5c + -1] =
           (int)((float)i * ((float)(local_5c + -1) / (float)((int)*v_local + -1) + 1.0));
      i = i ^ 0x80000000;
    }
    *_zero = 1;
    *isave = 5;
    return 0;
  case 4:
    iVar2 = isave[1];
    iVar3 = isamax_(n,x,(integer *)&one);
    isave[1] = iVar3;
    isave[1] = isave[1] + -1;
    dVar5 = (double)((ulong)(double)(float)isgn_local[isave[1]] & (ulong)DAT_0011da30);
    if ((((double)(float)isgn_local[iVar2] == dVar5) &&
        (!NAN((double)(float)isgn_local[iVar2]) && !NAN(dVar5))) || (4 < isave[2]))
    goto LAB_001190de;
    isave[2] = isave[2] + 1;
LAB_00118c57:
    for (local_5c = 0; local_5c < (int)*v_local; local_5c = local_5c + 1) {
      isgn_local[local_5c] = 0;
    }
    isgn_local[isave[1]] = 0x3f800000;
    *_zero = 1;
    *isave = 3;
    break;
  case 5:
    rVar4 = sasum_(n,x,(integer *)&one);
    fVar1 = (rVar4 / (float)((int)*v_local * 3)) * 2.0;
    if ((float)*kase_local <= fVar1 && fVar1 != (float)*kase_local) {
      scopy_((integer *)v_local,(real *)isgn_local,(integer *)&one,x_local,(integer *)&one);
      *kase_local = (int)fVar1;
    }
    goto LAB_001191f8;
  }
  return 0;
}

Assistant:

int
slacon2_(int *n, float *v, float *x, int *isgn, float *est, int *kase, int isave[3])
{
    /* Table of constant values */
    int c__1 = 1;
    float      zero = 0.0;
    float      one = 1.0;
    
    /* Local variables */
    int jlast;
    float altsgn, estold;
    int i;
    float temp;
#ifdef _CRAY
    extern int ISAMAX(int *, float *, int *);
    extern float SASUM(int *, float *, int *);
    extern int SCOPY(int *, float *, int *, float *, int *);
#else
    extern int isamax_(int *, float *, int *);
    extern float sasum_(int *, float *, int *);
    extern void scopy_(int *, float *, int *, float *, int *);
#endif
#define d_sign(a, b) (b >= 0 ? fabs(a) : -fabs(a))    /* Copy sign */
#define i_dnnt(a) \
	( a>=0 ? floor(a+.5) : -floor(.5-a) ) /* Round to nearest integer */

    if ( *kase == 0 ) {
	for (i = 0; i < *n; ++i) {
	    x[i] = 1. / (float) (*n);
	}
	*kase = 1;
	isave[0] = 1;	/* jump = 1; */
	return 0;
    }

    switch (isave[0]) {
	case 1:  goto L20;
	case 2:  goto L40;
	case 3:  goto L70;
	case 4:  goto L110;
	case 5:  goto L140;
    }

    /*     ................ ENTRY   (isave[0] == 1)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY A*X. */
  L20:
    if (*n == 1) {
	v[0] = x[0];
	*est = fabs(v[0]);
	/*        ... QUIT */
	goto L150;
    }
#ifdef _CRAY
    *est = SASUM(n, x, &c__1);
#else
    *est = sasum_(n, x, &c__1);
#endif

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 2;  /* jump = 2; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 2)   
	   FIRST ITERATION.  X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L40:
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);  /* j */
#else
    isave[1] = isamax_(n, &x[0], &c__1);  /* j */
#endif
    --isave[1];  /* --j; */
    isave[2] = 2; /* iter = 2; */

    /*     MAIN LOOP - ITERATIONS 2,3,...,ITMAX. */
L50:
    for (i = 0; i < *n; ++i) x[i] = zero;
    x[isave[1]] = one;
    *kase = 1;
    isave[0] = 3;  /* jump = 3; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 3)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L70:
#ifdef _CRAY
    SCOPY(n, x, &c__1, v, &c__1);
#else
    scopy_(n, x, &c__1, v, &c__1);
#endif
    estold = *est;
#ifdef _CRAY
    *est = SASUM(n, v, &c__1);
#else
    *est = sasum_(n, v, &c__1);
#endif

    for (i = 0; i < *n; ++i)
	if (i_dnnt(d_sign(one, x[i])) != isgn[i])
	    goto L90;

    /*     REPEATED SIGN VECTOR DETECTED, HENCE ALGORITHM HAS CONVERGED. */
    goto L120;

L90:
    /*     TEST FOR CYCLING. */
    if (*est <= estold) goto L120;

    for (i = 0; i < *n; ++i) {
	x[i] = d_sign(one, x[i]);
	isgn[i] = i_dnnt(x[i]);
    }
    *kase = 2;
    isave[0] = 4;  /* jump = 4; */
    return 0;

    /*     ................ ENTRY   (isave[0] == 4)
	   X HAS BEEN OVERWRITTEN BY TRANSPOSE(A)*X. */
L110:
    jlast = isave[1];  /* j; */
#ifdef _CRAY
    isave[1] = ISAMAX(n, &x[0], &c__1);/* j */
#else
    isave[1] = isamax_(n, &x[0], &c__1);  /* j */
#endif
    isave[1] = isave[1] - 1;  /* --j; */
    if (x[jlast] != fabs(x[isave[1]]) && isave[2] < 5) {
	isave[2] = isave[2] + 1;  /* ++iter; */
	goto L50;
    }

    /*     ITERATION COMPLETE.  FINAL STAGE. */
L120:
    altsgn = 1.;
    for (i = 1; i <= *n; ++i) {
	x[i-1] = altsgn * ((float)(i - 1) / (float)(*n - 1) + 1.);
	altsgn = -altsgn;
    }
    *kase = 1;
    isave[0] = 5;  /* jump = 5; */
    return 0;
    
    /*     ................ ENTRY   (isave[0] = 5)   
	   X HAS BEEN OVERWRITTEN BY A*X. */
L140:
#ifdef _CRAY
    temp = SASUM(n, x, &c__1) / (float)(*n * 3) * 2.;
#else
    temp = sasum_(n, x, &c__1) / (float)(*n * 3) * 2.;
#endif
    if (temp > *est) {
#ifdef _CRAY
	SCOPY(n, &x[0], &c__1, &v[0], &c__1);
#else
	scopy_(n, &x[0], &c__1, &v[0], &c__1);
#endif
	*est = temp;
    }

L150:
    *kase = 0;
    return 0;

}